

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_name_tests.cpp
# Opt level: O2

void __thiscall
iu_iuRenameParamTest_x_iutest_x_Test_Test::Body(iu_iuRenameParamTest_x_iutest_x_Test_Test *this)

{
  ParamType *pPVar1;
  TestInfo *pTVar2;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  pPVar1 = iutest::WithParamInterface<bool>::GetParam();
  if (*pPVar1 == true) {
    iutest::UnitTest::instance();
    pTVar2 = iutest::Test::GetCurrentTestInfo();
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)"\"Test/true\"",
               "::iutest::UnitTest::GetInstance()->current_test_info()->name()","Test/true",
               (pTVar2->m_testname)._M_dataplus._M_p,
               (char *)&iutest_type_traits::enabler_t<void>::value,
               (type **)iutest_ar.m_message._M_dataplus._M_p);
    if (iutest_ar.m_result != false) goto LAB_0011c897;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_name_tests.cpp"
               ,0x26,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  else {
    iutest::UnitTest::instance();
    pTVar2 = iutest::Test::GetCurrentTestInfo();
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)"\"Test/false\"",
               "::iutest::UnitTest::GetInstance()->current_test_info()->name()","Test/false",
               (pTVar2->m_testname)._M_dataplus._M_p,
               (char *)&iutest_type_traits::enabler_t<void>::value,
               (type **)iutest_ar.m_message._M_dataplus._M_p);
    if (iutest_ar.m_result != false) goto LAB_0011c897;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_name_tests.cpp"
               ,0x2a,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0011c897:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_P(iuRenameParamTest, Test)
{
    if( GetParam() )
    {
        IUTEST_ASSERT_STREQ("Test/true", ::iutest::UnitTest::GetInstance()->current_test_info()->name());
    }
    else
    {
        IUTEST_ASSERT_STREQ("Test/false", ::iutest::UnitTest::GetInstance()->current_test_info()->name());
    }
}